

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::FinishDeferredFunction(Parser *this,ParseNodeBlock *pnodeScopeList)

{
  anon_class_16_2_9bc0f637 fn;
  undefined1 local_60 [8];
  ParseContext parseContext;
  ParseNodeBlock *pnodeScopeList_local;
  Parser *this_local;
  
  parseContext._64_8_ = pnodeScopeList;
  CaptureContext(this,(ParseContext *)local_60);
  this->m_nextBlockId = *(int *)(parseContext._64_8_ + 0x58) + 1;
  fn.parseContext = (ParseContext *)local_60;
  fn.this = this;
  FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
            (this,(ParseNodePtr)parseContext._64_8_,fn);
  RestoreContext(this,(ParseContext *)local_60);
  return;
}

Assistant:

void Parser::FinishDeferredFunction(ParseNodeBlock * pnodeScopeList)
{
    ParseContext parseContext;
    this->CaptureContext(&parseContext);

    m_nextBlockId = pnodeScopeList->blockId + 1;

    FinishFunctionsInScope(pnodeScopeList,
        [this, &parseContext](ParseNodeFnc * pnodeFnc)
    {
        Assert(pnodeFnc->nop == knopFncDecl);

        // We need to scan this function based on the already known limits of the function declaration as some of
        // the state such as fAllowIn may not be available at this point. Some of this state depends on the context
        // of the function declaration. For example, a function declaration may be inside a for..in statement's var
        // declaration. It may not be appropriate/possible to try and save all such context information. Functions
        // that actually get deferred achieve this by going through the ParseSourceWithOffset code path.
        this->GetScanner()->Clear();
        this->GetScanner()->SetText(parseContext.pszSrc, pnodeFnc->cbMin /*+ this->m_scan.m_cMinTokMultiUnits*/, pnodeFnc->LengthInBytes(), pnodeFnc->ichMin, parseContext.isUtf8, parseContext.grfscr, pnodeFnc->lineNumber);
        this->GetScanner()->Scan();

        // Non-simple params (such as default) require a good amount of logic to put vars on appropriate scopes. ParseFncDecl handles it
        // properly (both on defer and non-defer case). This is to avoid write duplicated logic here as well. Function with non-simple-param
        // will remain deferred until they are called.
        if (pnodeFnc->pnodeBody == nullptr && !pnodeFnc->HasNonSimpleParameterList())
        {
            // Go back and generate an AST for this function.
            JS_ETW_INTERNAL(EventWriteJSCRIPT_PARSE_FUNC(this->GetScriptContext(), pnodeFnc->functionId, /*Undefer*/TRUE));

            ParseNodeFnc * pnodeFncSave = this->m_currentNodeFunc;
            this->m_currentNodeFunc = pnodeFnc;

            ParseNodeBlock * pnodeFncExprBlock = nullptr;
            ParseNodePtr pnodeName = pnodeFnc->pnodeName;
            if (pnodeName)
            {
                Assert(pnodeName->nop == knopVarDecl);
                ParseNodeVar * pnodeVarName = pnodeName->AsParseNodeVar();
                Assert(pnodeVarName->pnodeNext == nullptr);

                if (!pnodeFnc->IsDeclaration())
                {
                    // Set up the named function expression symbol so references inside the function can be bound.
                    pnodeFncExprBlock = this->StartParseBlock<true>(PnodeBlockType::Function, ScopeType_FuncExpr);
                    PidRefStack *ref = this->PushPidRef(pnodeVarName->pid);
                    pnodeVarName->symRef = ref->GetSymRef();
                    ref->SetSym(pnodeVarName->sym);

                    Scope *fncExprScope = pnodeFncExprBlock->scope;
                    fncExprScope->AddNewSymbol(pnodeVarName->sym);
                    pnodeFnc->scope = fncExprScope;
                }
            }

            ParseNodeBlock * pnodeBlock = this->StartParseBlock<true>(PnodeBlockType::Parameter, ScopeType_Parameter);
            pnodeFnc->pnodeScopes = pnodeBlock;
            m_ppnodeScope = &pnodeBlock->pnodeScopes;
            pnodeBlock->pnodeStmt = pnodeFnc;

            ParseNodePtr * varNodesList = &pnodeFnc->pnodeVars;
            ParseNodeVar * argNode = nullptr;
            if (!pnodeFnc->IsModule() && !pnodeFnc->IsLambda() && !(pnodeFnc->grfpn & PNodeFlags::fpnArguments_overriddenInParam))
            {
                ParseNodePtr *const ppnodeVarSave = m_ppnodeVar;
                m_ppnodeVar = &pnodeFnc->pnodeVars;

                argNode = this->AddArgumentsNodeToVars(pnodeFnc);

                varNodesList = m_ppnodeVar;
                m_ppnodeVar = ppnodeVarSave;
            }

            // Add the args to the scope, since we won't re-parse those.
            Scope *scope = pnodeBlock->scope;
            uint blockId = GetCurrentBlock()->blockId;
            uint funcId = GetCurrentFunctionNode()->functionId;
            auto addArgsToScope = [&](ParseNodePtr pnodeArg) {
                if (pnodeArg->IsVarLetOrConst())
                {
                    ParseNodeVar * pnodeVarArg = pnodeArg->AsParseNodeVar();

                    PidRefStack *ref = this->FindOrAddPidRef(pnodeVarArg->pid, blockId, funcId);
                    pnodeVarArg->symRef = ref->GetSymRef();
                    if (ref->GetSym() != nullptr)
                    {
                        // Duplicate parameter in a configuration that allows them.
                        // The symbol is already in the scope, just point it to the right declaration.
                        Assert(ref->GetSym() == pnodeVarArg->sym);
                        ref->GetSym()->SetDecl(pnodeVarArg);
                    }
                    else
                    {
                        ref->SetSym(pnodeArg->AsParseNodeVar()->sym);
                        scope->AddNewSymbol(pnodeVarArg->sym);
                    }
                }
            };

            MapFormals(pnodeFnc, addArgsToScope);
            MapFormalsFromPattern(pnodeFnc, addArgsToScope);

            ParseNodeBlock * pnodeInnerBlock = this->StartParseBlock<true>(PnodeBlockType::Function, ScopeType_FunctionBody);
            pnodeFnc->pnodeBodyScope = pnodeInnerBlock;

            // Set the parameter block's child to the function body block.
            *m_ppnodeScope = pnodeInnerBlock;

            ParseNodePtr *ppnodeScopeSave = nullptr;
            ParseNodePtr *ppnodeExprScopeSave = nullptr;

            ppnodeScopeSave = m_ppnodeScope;

            // This synthetic block scope will contain all the nested scopes.
            m_ppnodeScope = &pnodeInnerBlock->pnodeScopes;
            pnodeInnerBlock->pnodeStmt = pnodeFnc;

            // Keep nested function declarations and expressions in the same list at function scope.
            // (Indicate this by nulling out the current function expressions list.)
            ppnodeExprScopeSave = m_ppnodeExprScope;
            m_ppnodeExprScope = nullptr;

            // Shouldn't be any temps in the arg list.
            Assert(*m_ppnodeVar == nullptr);

            // Start the var list.
            m_ppnodeVar = varNodesList;

            if (scope != nullptr)
            {
                Assert(pnodeFnc->IsBodyAndParamScopeMerged());
                blockId = GetCurrentBlock()->blockId;
                funcId = GetCurrentFunctionNode()->functionId;
                scope->ForEachSymbol([this, blockId, funcId](Symbol* paramSym)
                {
                    PidRefStack* ref = this->FindOrAddPidRef(paramSym->GetPid(), blockId, funcId);
                    ref->SetSym(paramSym);
                });
            }

            Assert(m_currentNodeNonLambdaFunc == nullptr);
            m_currentNodeNonLambdaFunc = pnodeFnc;

            this->FinishFncNode(pnodeFnc);

            Assert(pnodeFnc == m_currentNodeNonLambdaFunc);
            m_currentNodeNonLambdaFunc = nullptr;

            m_ppnodeExprScope = ppnodeExprScopeSave;

            Assert(m_ppnodeScope);
            Assert(nullptr == *m_ppnodeScope);
            m_ppnodeScope = ppnodeScopeSave;

            this->FinishParseBlock(pnodeInnerBlock);

            if (!pnodeFnc->IsModule() && (m_token.tk == tkLCurly || !pnodeFnc->IsLambda()))
            {
                UpdateArgumentsNode(pnodeFnc, argNode);
            }

            CreateSpecialSymbolDeclarations(pnodeFnc);

            this->FinishParseBlock(pnodeBlock);
            if (pnodeFncExprBlock)
            {
                this->FinishParseBlock(pnodeFncExprBlock);
            }

            this->m_currentNodeFunc = pnodeFncSave;
        }
    });

    this->RestoreContext(&parseContext);
}